

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeMessageTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  MessageLite *in_RSI;
  long *in_RDI;
  int num_fields;
  int cached_size;
  uint8 *base;
  FieldMetadata *field_table;
  SerializationTable *table;
  ArrayOutput *in_stack_00000058;
  MessageLite *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffffd0;
  uint32 length;
  FieldMetadata *field_table_00;
  
  length = (uint32)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (in_RSI == (MessageLite *)0x0) {
    (**(code **)(*in_RDI + 0x60))();
    WriteLengthTo<google::protobuf::internal::ArrayOutput>
              (length,(ArrayOutput *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    SerializeMessageNoTable(in_stack_00000060,in_stack_00000058);
  }
  else {
    field_table_00 = (FieldMetadata *)in_RSI[1]._vptr_MessageLite;
    uVar1 = *(undefined4 *)((long)in_RDI + (ulong)field_table_00->offset);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>
              ((uint32)((ulong)in_RDI >> 0x20),
               (ArrayOutput *)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
    SerializeMessageDispatch
              (in_RSI,field_table_00,(int)((ulong)in_RDI >> 0x20),(int32)in_RDI,
               (ArrayOutput *)CONCAT44(uVar1,*(int *)&in_RSI->_vptr_MessageLite + -1));
  }
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}